

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool perfetto::internal::TrackEventInternal::IsCategoryEnabled
               (TrackEventCategoryRegistry *registry,TrackEventConfig *config,Category *category)

{
  byte bVar1;
  pointer pbVar2;
  MatchType MVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  const_iterator __end2;
  ulong __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pattern;
  char *pcVar8;
  pointer pbVar9;
  long lVar10;
  Category *category_00;
  long lVar11;
  size_t sVar12;
  value_type match_type;
  array<perfetto::internal::(anonymous_namespace)::MatchType,_2UL> match_types;
  allocator<char> local_e5;
  MatchType local_e4;
  TrackEventCategoryRegistry *local_e0;
  TrackEventConfig *local_d8;
  undefined1 local_d0 [56];
  TrackEventConfig *local_98;
  MatchType *local_90;
  code *local_88;
  code *local_80;
  TrackEventConfig *local_78;
  MatchType *local_70;
  code *local_68;
  code *local_60;
  long *local_58 [2];
  long local_48 [2];
  Category *local_38;
  
  local_d8 = config;
  if ((category->name_sizes_)._M_elems[1] == '\0') {
    local_58[0] = (long *)0x100000000;
    local_e0 = (TrackEventCategoryRegistry *)0x0;
    do {
      local_e4 = *(MatchType *)((long)local_58 + (long)local_e0);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_d0,category->name,&local_e5);
      MVar3 = local_e4;
      pbVar9 = (local_d8->enabled_categories_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (local_d8->enabled_categories_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar9 == pbVar2) {
        bVar4 = false;
      }
      else {
        do {
          bVar4 = anon_unknown_17::NameMatchesPattern(pbVar9,(string *)local_d0,MVar3);
          pbVar9 = pbVar9 + 1;
        } while (pbVar9 != pbVar2 && !bVar4);
      }
      if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
        operator_delete((void *)local_d0._0_8_,(ulong)(local_d0._16_8_ + 1));
      }
      if (bVar4 != false) {
        return true;
      }
      local_78 = local_d8;
      local_70 = &local_e4;
      local_60 = std::
                 _Function_handler<bool_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:45319:26)>
                 ::_M_invoke;
      local_68 = std::
                 _Function_handler<bool_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:45319:26)>
                 ::_M_manager;
      lVar11 = 0x10;
      do {
        pcVar8 = *(char **)((long)(category->tags)._M_elems + lVar11 + -0x10);
        if (pcVar8 == (char *)0x0) break;
        local_d0._0_8_ = pcVar8;
        if (local_68 == (code *)0x0) goto LAB_002a9be4;
        cVar5 = (*local_60)(&local_78,(string *)local_d0);
        if (cVar5 != '\0') {
          bVar4 = true;
          goto LAB_002a9a53;
        }
        lVar11 = lVar11 + 8;
      } while (lVar11 != 0x30);
      iVar6 = strncmp(category->name,"disabled-by-default-",0x14);
      if (iVar6 == 0) {
        local_d0._0_8_ = &(anonymous_namespace)::kSlowTag;
        if (local_68 == (code *)0x0) {
LAB_002a9be4:
          ::std::__throw_bad_function_call();
        }
        cVar5 = (*local_60)(&local_78,(string *)local_d0);
        bVar4 = true;
        if (cVar5 == '\0') goto LAB_002a9a4c;
      }
      else {
LAB_002a9a4c:
        bVar4 = false;
      }
LAB_002a9a53:
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      if (bVar4) {
        return true;
      }
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_d0,category->name,&local_e5);
      MVar3 = local_e4;
      pbVar9 = (local_d8->disabled_categories_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (local_d8->disabled_categories_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar9 == pbVar2) {
        bVar4 = false;
      }
      else {
        do {
          bVar4 = anon_unknown_17::NameMatchesPattern(pbVar9,(string *)local_d0,MVar3);
          pbVar9 = pbVar9 + 1;
        } while (pbVar9 != pbVar2 && !bVar4);
      }
      if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
        operator_delete((void *)local_d0._0_8_,(ulong)(local_d0._16_8_ + 1));
      }
      if (bVar4 != false) goto LAB_002a9bcc;
      local_98 = local_d8;
      local_90 = &local_e4;
      local_80 = std::
                 _Function_handler<bool_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:45332:26)>
                 ::_M_invoke;
      local_88 = std::
                 _Function_handler<bool_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:45332:26)>
                 ::_M_manager;
      lVar11 = 0x10;
      do {
        pcVar8 = *(char **)((long)(category->tags)._M_elems + lVar11 + -0x10);
        if (pcVar8 == (char *)0x0) break;
        local_d0._0_8_ = pcVar8;
        if (local_88 == (code *)0x0) goto LAB_002a9be9;
        cVar5 = (*local_80)(&local_98,(string *)local_d0);
        if (cVar5 != '\0') goto LAB_002a9b90;
        lVar11 = lVar11 + 8;
      } while (lVar11 != 0x30);
      iVar6 = strncmp(category->name,"disabled-by-default-",0x14);
      if (iVar6 == 0) {
        local_d0._0_8_ = &(anonymous_namespace)::kSlowTag;
        if (local_88 == (code *)0x0) {
LAB_002a9be9:
          ::std::__throw_bad_function_call();
        }
        cVar5 = (*local_80)(&local_98,(string *)local_d0);
        if (cVar5 == '\0') goto LAB_002a9b95;
LAB_002a9b90:
        bVar4 = false;
      }
      else {
LAB_002a9b95:
        bVar4 = true;
      }
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,3);
      }
      local_e0 = (TrackEventCategoryRegistry *)((long)local_e0 + 4);
    } while ((bool)(bVar4 & local_e0 != (TrackEventCategoryRegistry *)0x8));
  }
  else {
    pcVar8 = category->name;
    lVar11 = 1;
    lVar10 = 0;
    local_e0 = registry;
    local_38 = category;
    do {
      lVar7 = lVar11;
      bVar1 = (category->name_sizes_)._M_elems[lVar10];
      __n = (ulong)bVar1;
      if (__n == 0) break;
      sVar12 = local_e0->category_count_;
      if (sVar12 != 0) {
        category_00 = local_e0->categories_;
        do {
          if ((((category_00->name_sizes_)._M_elems[1] == '\0') &&
              ((category_00->name_sizes_)._M_elems[0] == bVar1)) &&
             (iVar6 = strncmp(category_00->name,pcVar8,__n), iVar6 == 0)) {
            bVar4 = IsCategoryEnabled(local_e0,local_d8,category_00);
            if (bVar4) {
              return true;
            }
            break;
          }
          category_00 = category_00 + 1;
          sVar12 = sVar12 - 1;
        } while (sVar12 != 0);
      }
      local_d0._0_8_ = local_d0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,pcVar8,pcVar8 + __n);
      local_58[0] = local_48;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,local_d0._0_8_,(char *)(local_d0._8_8_ + local_d0._0_8_));
      category = local_38;
      if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
        operator_delete((void *)local_d0._0_8_,(ulong)(local_d0._16_8_ + 1));
      }
      Category::FromDynamicCategory((Category *)local_d0,(char *)local_58[0]);
      bVar4 = IsCategoryEnabled(local_e0,local_d8,(Category *)local_d0);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      if (bVar4) {
        return true;
      }
      pcVar8 = pcVar8 + __n + 1;
      lVar11 = lVar7 + 1;
      lVar10 = lVar7;
    } while (lVar11 != 5);
LAB_002a9bcc:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool TrackEventInternal::IsCategoryEnabled(
    const TrackEventCategoryRegistry& registry,
    const protos::gen::TrackEventConfig& config,
    const Category& category) {
  // If this is a group category, check if any of its constituent categories are
  // enabled. If so, then this one is enabled too.
  if (category.IsGroup()) {
    bool result = false;
    category.ForEachGroupMember([&](const char* member_name, size_t name_size) {
      for (size_t i = 0; i < registry.category_count(); i++) {
        const auto ref_category = registry.GetCategory(i);
        // Groups can't refer to other groups.
        if (ref_category->IsGroup())
          continue;
        // Require an exact match.
        if (ref_category->name_size() != name_size ||
            strncmp(ref_category->name, member_name, name_size)) {
          continue;
        }
        if (IsCategoryEnabled(registry, config, *ref_category)) {
          result = true;
          // Break ForEachGroupMember() loop.
          return false;
        }
        break;
      }
      // No match? Must be a dynamic category.
      DynamicCategory dyn_category(std::string(member_name, name_size));
      Category ref_category{Category::FromDynamicCategory(dyn_category)};
      if (IsCategoryEnabled(registry, config, ref_category)) {
        result = true;
        // Break ForEachGroupMember() loop.
        return false;
      }
      // No match found => keep iterating.
      return true;
    });
    return result;
  }

  auto has_matching_tag = [&](std::function<bool(const char*)> matcher) {
    for (const auto& tag : category.tags) {
      if (!tag)
        break;
      if (matcher(tag))
        return true;
    }
    // Legacy "disabled-by-default" categories automatically get the "slow" tag.
    if (!strncmp(category.name, kLegacySlowPrefix, strlen(kLegacySlowPrefix)) &&
        matcher(kSlowTag)) {
      return true;
    }
    return false;
  };

  // First try exact matches, then pattern matches.
  const std::array<MatchType, 2> match_types = {
      {MatchType::kExact, MatchType::kPattern}};
  for (auto match_type : match_types) {
    // 1. Enabled categories.
    if (NameMatchesPatternList(config.enabled_categories(), category.name,
                               match_type)) {
      return true;
    }

    // 2. Enabled tags.
    if (has_matching_tag([&](const char* tag) {
          return NameMatchesPatternList(config.enabled_tags(), tag, match_type);
        })) {
      return true;
    }

    // 3. Disabled categories.
    if (NameMatchesPatternList(config.disabled_categories(), category.name,
                               match_type)) {
      return false;
    }

    // 4. Disabled tags.
    if (has_matching_tag([&](const char* tag) {
          if (config.disabled_tags_size()) {
            return NameMatchesPatternList(config.disabled_tags(), tag,
                                          match_type);
          } else {
            // The "slow" and "debug" tags are disabled by default.
            return NameMatchesPattern(kSlowTag, tag, match_type) ||
                   NameMatchesPattern(kDebugTag, tag, match_type);
          }
        })) {
      return false;
    }
  }

  // If nothing matched, enable the category by default.
  return true;
}